

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeEmpty(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  uint *puVar2;
  fpclass_type fVar3;
  int *piVar4;
  undefined8 uVar5;
  bool bVar6;
  type_conflict5 tVar7;
  EmptyConstraintPS *this_01;
  double *pdVar8;
  pointer pnVar9;
  FixBoundsPS *this_02;
  FixVariablePS *this_03;
  SPxOut *pSVar10;
  uint uVar11;
  int t;
  int32_t iVar12;
  int t_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  uint local_438 [2];
  undefined5 uStack_430;
  undefined3 uStack_42b;
  undefined5 local_428;
  undefined3 uStack_423;
  int local_420;
  undefined1 local_41c;
  undefined8 local_418;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr2;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_3c8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  element_type *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3a0;
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  int local_380;
  bool local_37c;
  fpclass_type local_378;
  int32_t local_374;
  element_type *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  uint local_358 [2];
  uint auStack_350 [2];
  uint local_348 [2];
  int local_340;
  bool local_33c;
  fpclass_type local_338;
  int32_t iStack_334;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr1;
  cpp_dec_float<50U,_int,_void> local_1f0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar11 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  psVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  this_00 = &this->m_hist;
  t = 0;
  do {
    do {
      if ((int)uVar11 < 1) {
        uVar11 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        t_00 = 0;
        goto LAB_0027e310;
      }
      uVar11 = uVar11 - 1;
    } while ((lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem
             [(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar11].idx].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused != 0);
    pnVar9 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_268.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 8);
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar11].m_backend.data;
    local_268.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 2);
    puVar2 = pnVar9[uVar11].m_backend.data._M_elems + 4;
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_268.m_backend.exp = pnVar9[uVar11].m_backend.exp;
    local_268.m_backend.neg = pnVar9[uVar11].m_backend.neg;
    local_268.m_backend.fpclass = pnVar9[uVar11].m_backend.fpclass;
    local_268.m_backend.prec_elem = pnVar9[uVar11].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_1b8,0.0,(type *)0x0);
    feastol(&local_68,this);
    bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_268,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1b8,&local_68);
    if (bVar6) {
      return INFEASIBLE;
    }
    pnVar9 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 8);
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar11].m_backend.data;
    local_2a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 2);
    puVar2 = pnVar9[uVar11].m_backend.data._M_elems + 4;
    local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_2a8.m_backend.exp = pnVar9[uVar11].m_backend.exp;
    local_2a8.m_backend.neg = pnVar9[uVar11].m_backend.neg;
    local_2a8.m_backend.fpclass = pnVar9[uVar11].m_backend.fpclass;
    local_2a8.m_backend.prec_elem = pnVar9[uVar11].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,0.0,(type *)0x0);
    feastol(&local_d8,this);
    bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_2a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0,&local_d8);
    if (bVar6) {
      return INFEASIBLE;
    }
    this_01 = (EmptyConstraintPS *)operator_new(0x68);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_3d8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    EmptyConstraintPS::EmptyConstraintPS
              (this_01,lp,uVar11,(shared_ptr<soplex::Tolerances> *)&local_3d8);
    std::
    __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::EmptyConstraintPS,void>
              ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                *)&ptr,this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d8._M_refcount);
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
    ::push_back(&this_00->data,(value_type *)&ptr);
    removeRow(this,lp,uVar11);
    t = t + 1;
    piVar4 = (this->m_stat).data;
    *piVar4 = *piVar4 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while( true );
LAB_0027e310:
  do {
    if ((int)uVar11 < 1) {
      if (t_00 == 0 && t == 0) {
        return OKAY;
      }
      piVar4 = &(this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remRows;
      *piVar4 = *piVar4 + t;
      piVar4 = &(this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remCols;
      *piVar4 = *piVar4 + t_00;
      pSVar10 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar10 != (SPxOut *)0x0) {
        if (3 < (int)pSVar10->m_verbosity) {
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    CONCAT44(ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._4_4_,pSVar10->m_verbosity);
          ptr1.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ = 4;
          (*pSVar10->_vptr_SPxOut[2])();
          pSVar10 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (empty rows/colums) removed ");
          pSVar10 = soplex::operator<<(pSVar10,t);
          pSVar10 = soplex::operator<<(pSVar10," rows, ");
          pSVar10 = soplex::operator<<(pSVar10,t_00);
          pSVar10 = soplex::operator<<(pSVar10," cols");
          std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
          pSVar10 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar10->_vptr_SPxOut[2])(pSVar10,&ptr);
          return OKAY;
        }
        return OKAY;
      }
      return OKAY;
    }
    uVar11 = uVar11 - 1;
  } while ((lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem
           [(lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[uVar11].idx].data.
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused != 0);
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).object.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_418._0_4_ = cpp_dec_float_finite;
  local_418._4_4_ = 10;
  uVar5 = local_418;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_438[0] = 0;
  local_438[1] = 0;
  uStack_430 = 0;
  uStack_42b = 0;
  local_428 = 0;
  uStack_423 = 0;
  local_420 = 0;
  local_41c = 0;
  local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar11].m_backend.data;
  local_2e8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 2);
  puVar2 = pnVar9[uVar11].m_backend.data._M_elems + 4;
  local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_2e8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 8);
  local_2e8.m_backend.exp = pnVar9[uVar11].m_backend.exp;
  local_2e8.m_backend.neg = pnVar9[uVar11].m_backend.neg;
  local_2e8.m_backend.fpclass = pnVar9[uVar11].m_backend.fpclass;
  local_2e8.m_backend.prec_elem = pnVar9[uVar11].m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_1f0,0.0,(type *)0x0);
  epsZero(&local_110,this);
  bVar6 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_2e8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1f0,&local_110);
  if (bVar6) {
    pnVar9 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&ptr1,*pdVar8,(type *)0x0);
    tVar7 = boost::multiprecision::operator>=
                      (pnVar9 + uVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ptr1);
    if (tVar7) {
      return UNBOUNDED;
    }
LAB_0027e437:
    pnVar9 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0027e54a:
    uVar5 = *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 8);
    local_428 = (undefined5)uVar5;
    uStack_423 = (undefined3)((ulong)uVar5 >> 0x28);
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = *(element_type **)&pnVar9[uVar11].m_backend.data;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          (pnVar9[uVar11].m_backend.data._M_elems + 2);
    puVar2 = pnVar9[uVar11].m_backend.data._M_elems + 4;
    local_438 = *(uint (*) [2])puVar2;
    uVar5 = *(undefined8 *)(puVar2 + 2);
    uStack_430 = (undefined5)uVar5;
    uStack_42b = (undefined3)((ulong)uVar5 >> 0x28);
    local_420 = pnVar9[uVar11].m_backend.exp;
    local_41c = pnVar9[uVar11].m_backend.neg;
    local_418._0_4_ = pnVar9[uVar11].m_backend.fpclass;
    local_418._4_4_ = pnVar9[uVar11].m_backend.prec_elem;
    iVar12 = local_418._4_4_;
    fVar3 = (fpclass_type)local_418;
  }
  else {
    pnVar9 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_328.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 8);
    local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar11].m_backend.data;
    local_328.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar9[uVar11].m_backend.data._M_elems + 2);
    puVar2 = pnVar9[uVar11].m_backend.data._M_elems + 4;
    local_328.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_328.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_328.m_backend.exp = pnVar9[uVar11].m_backend.exp;
    local_328.m_backend.neg = pnVar9[uVar11].m_backend.neg;
    local_328.m_backend.fpclass = pnVar9[uVar11].m_backend.fpclass;
    local_328.m_backend.prec_elem = pnVar9[uVar11].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_148,0.0,(type *)0x0);
    epsZero(&local_180,this);
    bVar6 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_328,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_148,&local_180);
    a = (lp->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).low.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start + uVar11;
    if (bVar6) {
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr1,-*pdVar8,(type *)0x0);
      tVar7 = boost::multiprecision::operator<=
                        (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr1);
      if (tVar7) {
        return UNBOUNDED;
      }
LAB_0027e543:
      pnVar9 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0027e54a;
    }
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&ptr1,-*pdVar8,(type *)0x0);
    tVar7 = boost::multiprecision::operator>
                      (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr1);
    if (tVar7) goto LAB_0027e543;
    pnVar9 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&ptr1,*pdVar8,(type *)0x0);
    tVar7 = boost::multiprecision::operator<
                      (pnVar9 + uVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ptr1);
    if (tVar7) goto LAB_0027e437;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&ptr,0.0);
    local_418._0_4_ = cpp_dec_float_finite;
    local_418._4_4_ = 10;
    iVar12 = local_418._4_4_;
    fVar3 = (fpclass_type)local_418;
    local_418 = uVar5;
  }
  this_02 = (FixBoundsPS *)operator_new(0x30);
  auStack_390[1]._1_3_ = uStack_42b;
  auStack_390._0_5_ = uStack_430;
  local_3a8 = ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Stack_3a0 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_398[0] = local_438[0];
  local_398[1] = local_438[1];
  local_388[1]._1_3_ = uStack_423;
  local_388._0_5_ = local_428;
  local_380 = local_420;
  local_37c = (bool)local_41c;
  local_378 = fVar3;
  local_374 = iVar12;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3b8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
  ;
  FixBoundsPS::FixBoundsPS
            (this_02,lp,uVar11,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_3a8,(shared_ptr<soplex::Tolerances> *)&local_3b8);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr1,this_02);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
  this_03 = (FixVariablePS *)operator_new(0x138);
  local_348[1]._1_3_ = uStack_423;
  local_348._0_5_ = local_428;
  auStack_350[1]._1_3_ = uStack_42b;
  auStack_350._0_5_ = uStack_430;
  local_358[0] = local_438[0];
  local_358[1] = local_438[1];
  local_368 = ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  p_Stack_360 = ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_340 = local_420;
  local_33c = (bool)local_41c;
  local_338 = (fpclass_type)local_418;
  iStack_334 = local_418._4_4_;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3c8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
  ;
  FixVariablePS::FixVariablePS
            (this_03,lp,this,uVar11,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_368,(shared_ptr<soplex::Tolerances> *)&local_3c8,true);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr2,this_03);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&this_00->data,&ptr1);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&this_00->data,&ptr2);
  removeCol(this,lp,uVar11);
  t_00 = t_00 + 1;
  piVar4 = (this->m_stat).data + 4;
  *piVar4 = *piVar4 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr2.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr1.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  goto LAB_0027e310;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}